

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tag_scalar.hpp
# Opt level: O0

void __thiscall
cfgfile::tag_scalar_t<int,_cfgfile::qstring_trait_t>::on_finish
          (tag_scalar_t<int,_cfgfile::qstring_trait_t> *this,
          parser_info_t<cfgfile::qstring_trait_t> *info)

{
  bool bVar1;
  int iVar2;
  undefined8 uVar3;
  undefined4 extraout_var;
  reference pptVar4;
  parser_info_t<cfgfile::qstring_trait_t> *in_RSI;
  tag_t<cfgfile::qstring_trait_t> *in_RDI;
  tag_t<cfgfile::qstring_trait_t> *tag;
  const_iterator __end0;
  const_iterator __begin0;
  child_tags_list_t *__range2;
  vector<cfgfile::tag_t<cfgfile::qstring_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::qstring_trait_t>_*>_>
  *in_stack_fffffffffffffb98;
  __normal_iterator<cfgfile::tag_t<cfgfile::qstring_trait_t>_*const_*,_std::vector<cfgfile::tag_t<cfgfile::qstring_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::qstring_trait_t>_*>_>_>
  *in_stack_fffffffffffffba0;
  string_t *in_stack_fffffffffffffba8;
  string_t *what;
  exception_t<cfgfile::qstring_trait_t> *in_stack_fffffffffffffbb0;
  exception_t<cfgfile::qstring_trait_t> *this_00;
  tag_t<cfgfile::qstring_trait_t> *in_stack_fffffffffffffbb8;
  allocator<char> *in_stack_fffffffffffffbd0;
  allocator<char> *__a;
  string *in_stack_fffffffffffffbd8;
  string *str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffbe0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  string_t local_3a1 [2];
  exception_t<cfgfile::qstring_trait_t> local_361 [9];
  tag_t<cfgfile::qstring_trait_t> *local_1e8;
  tag_t<cfgfile::qstring_trait_t> **local_1e0;
  __normal_iterator<cfgfile::tag_t<cfgfile::qstring_trait_t>_*const_*,_std::vector<cfgfile::tag_t<cfgfile::qstring_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::qstring_trait_t>_*>_>_>
  local_1d8;
  undefined8 local_1d0;
  undefined1 local_1c2;
  allocator<char> local_1c1 [88];
  string local_169 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_129 [8];
  parser_info_t<cfgfile::qstring_trait_t> *local_10;
  
  local_10 = in_RSI;
  bVar1 = tag_t<cfgfile::qstring_trait_t>::is_defined_member_value(in_RDI);
  if (!bVar1) {
    local_1c2 = 1;
    uVar3 = __cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffbe0,(char *)in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd0
              );
    qstring_trait_t::from_ascii(in_stack_fffffffffffffbd8);
    tag_t<cfgfile::qstring_trait_t>::name(in_RDI);
    operator+((qstring_wrapper_t *)in_stack_fffffffffffffbd8,
              (qstring_wrapper_t *)in_stack_fffffffffffffbd0);
    this_01 = local_129;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (this_01,(char *)in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd0);
    qstring_trait_t::from_ascii(in_stack_fffffffffffffbd8);
    operator+((qstring_wrapper_t *)in_stack_fffffffffffffbd8,
              (qstring_wrapper_t *)in_stack_fffffffffffffbd0);
    parser_info_t<cfgfile::qstring_trait_t>::file_name(local_10);
    operator+((qstring_wrapper_t *)in_stack_fffffffffffffbd8,
              (qstring_wrapper_t *)in_stack_fffffffffffffbd0);
    str = local_169;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (this_01,(char *)str,in_stack_fffffffffffffbd0);
    qstring_trait_t::from_ascii(str);
    operator+((qstring_wrapper_t *)str,(qstring_wrapper_t *)in_stack_fffffffffffffbd0);
    parser_info_t<cfgfile::qstring_trait_t>::line_number(local_10);
    qstring_trait_t::to_string((pos_t)str);
    operator+((qstring_wrapper_t *)str,(qstring_wrapper_t *)in_stack_fffffffffffffbd0);
    __a = local_1c1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(this_01,(char *)str,__a);
    qstring_trait_t::from_ascii(str);
    operator+((qstring_wrapper_t *)str,(qstring_wrapper_t *)__a);
    exception_t<cfgfile::qstring_trait_t>::exception_t
              (in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8);
    local_1c2 = 0;
    __cxa_throw(uVar3,&exception_t<cfgfile::qstring_trait_t>::typeinfo,
                exception_t<cfgfile::qstring_trait_t>::~exception_t);
  }
  iVar2 = (*in_RDI->_vptr_tag_t[2])();
  local_1d0 = CONCAT44(extraout_var,iVar2);
  local_1d8._M_current =
       (tag_t<cfgfile::qstring_trait_t> **)
       std::
       vector<cfgfile::tag_t<cfgfile::qstring_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::qstring_trait_t>_*>_>
       ::begin(in_stack_fffffffffffffb98);
  local_1e0 = (tag_t<cfgfile::qstring_trait_t> **)
              std::
              vector<cfgfile::tag_t<cfgfile::qstring_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::qstring_trait_t>_*>_>
              ::end(in_stack_fffffffffffffb98);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (in_stack_fffffffffffffba0,
                       (__normal_iterator<cfgfile::tag_t<cfgfile::qstring_trait_t>_*const_*,_std::vector<cfgfile::tag_t<cfgfile::qstring_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::qstring_trait_t>_*>_>_>
                        *)in_stack_fffffffffffffb98);
    if (!bVar1) {
      return;
    }
    pptVar4 = __gnu_cxx::
              __normal_iterator<cfgfile::tag_t<cfgfile::qstring_trait_t>_*const_*,_std::vector<cfgfile::tag_t<cfgfile::qstring_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::qstring_trait_t>_*>_>_>
              ::operator*(&local_1d8);
    local_1e8 = *pptVar4;
    bVar1 = tag_t<cfgfile::qstring_trait_t>::is_mandatory(local_1e8);
    if ((bVar1) &&
       (bVar1 = tag_t<cfgfile::qstring_trait_t>::is_defined(in_stack_fffffffffffffbb8), !bVar1))
    break;
    __gnu_cxx::
    __normal_iterator<cfgfile::tag_t<cfgfile::qstring_trait_t>_*const_*,_std::vector<cfgfile::tag_t<cfgfile::qstring_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::qstring_trait_t>_*>_>_>
    ::operator++(&local_1d8);
  }
  uVar3 = __cxa_allocate_exception(0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffbe0,(char *)in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd0);
  qstring_trait_t::from_ascii(in_stack_fffffffffffffbd8);
  tag_t<cfgfile::qstring_trait_t>::name(local_1e8);
  operator+((qstring_wrapper_t *)in_stack_fffffffffffffbd8,
            (qstring_wrapper_t *)in_stack_fffffffffffffbd0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffbe0,(char *)in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd0);
  qstring_trait_t::from_ascii(in_stack_fffffffffffffbd8);
  operator+((qstring_wrapper_t *)in_stack_fffffffffffffbd8,
            (qstring_wrapper_t *)in_stack_fffffffffffffbd0);
  tag_t<cfgfile::qstring_trait_t>::name(in_RDI);
  operator+((qstring_wrapper_t *)in_stack_fffffffffffffbd8,
            (qstring_wrapper_t *)in_stack_fffffffffffffbd0);
  this_00 = local_361;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffbe0,(char *)in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd0);
  qstring_trait_t::from_ascii(in_stack_fffffffffffffbd8);
  operator+((qstring_wrapper_t *)in_stack_fffffffffffffbd8,
            (qstring_wrapper_t *)in_stack_fffffffffffffbd0);
  parser_info_t<cfgfile::qstring_trait_t>::file_name(local_10);
  operator+((qstring_wrapper_t *)in_stack_fffffffffffffbd8,
            (qstring_wrapper_t *)in_stack_fffffffffffffbd0);
  what = local_3a1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffbe0,(char *)in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd0);
  qstring_trait_t::from_ascii(in_stack_fffffffffffffbd8);
  operator+((qstring_wrapper_t *)in_stack_fffffffffffffbd8,
            (qstring_wrapper_t *)in_stack_fffffffffffffbd0);
  parser_info_t<cfgfile::qstring_trait_t>::line_number(local_10);
  qstring_trait_t::to_string((pos_t)in_stack_fffffffffffffbd8);
  operator+((qstring_wrapper_t *)in_stack_fffffffffffffbd8,
            (qstring_wrapper_t *)in_stack_fffffffffffffbd0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffbe0,(char *)in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd0);
  qstring_trait_t::from_ascii(in_stack_fffffffffffffbd8);
  operator+((qstring_wrapper_t *)in_stack_fffffffffffffbd8,
            (qstring_wrapper_t *)in_stack_fffffffffffffbd0);
  exception_t<cfgfile::qstring_trait_t>::exception_t(this_00,what);
  __cxa_throw(uVar3,&exception_t<cfgfile::qstring_trait_t>::typeinfo,
              exception_t<cfgfile::qstring_trait_t>::~exception_t);
}

Assistant:

void on_finish( const parser_info_t< Trait > & info ) override
	{
		if( !this->is_defined_member_value() )
			throw exception_t< Trait >(
				Trait::from_ascii( "Undefined value of tag: \"" ) +
				this->name() + Trait::from_ascii( "\". In file \"" ) +
				info.file_name() +
				Trait::from_ascii( "\" on line " ) +
				Trait::to_string( info.line_number() ) +
				Trait::from_ascii( "." ) );

		for( const tag_t< Trait > * tag : this->children() )
		{
			if( tag->is_mandatory() && !tag->is_defined() )
				throw exception_t< Trait >(
					Trait::from_ascii( "Undefined child mandatory tag: \"" ) +
					tag->name() + Trait::from_ascii( "\". Where parent is: \"" ) +
					this->name() + Trait::from_ascii( "\". In file \"" ) +
					info.file_name() +
					Trait::from_ascii( "\" on line " ) +
					Trait::to_string( info.line_number() ) +
					Trait::from_ascii( "." ) );
		}
	}